

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

void lzham::vector<lzham::lzcompressor::lzpriced_decision>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  lzpriced_decision *pSrc;
  
  for (lVar4 = 0; (ulong)num * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
    puVar1 = (undefined8 *)((long)pSrc_void + lVar4);
    puVar2 = (undefined8 *)((long)pDst_void + lVar4);
    puVar2[2] = puVar1[2];
    uVar3 = puVar1[1];
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            pSrc++;
            pDst++;
         }
      }